

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Row
          (SPxSolverBase<double> *this,double direction,SPxId enterId)

{
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_00;
  DSVectorBase<double> *this_01;
  int iVar1;
  int j;
  long lVar2;
  SPxId spxid;
  DataKey local_70;
  DataKey local_68;
  double local_60;
  DataKey local_58;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_48 = *(double *)(&DAT_002ce3d0 + (ulong)(0.0 < direction) * 8);
  uStack_40 = 0;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  this_01 = &this->dualFarkas;
  local_68 = enterId.super_DataKey;
  local_50 = enterId.super_DataKey;
  DSVectorBase<double>::setMax(this_01,(this->theFvec->thedelta).super_IdxSet.num + 1);
  this_00 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set;
  for (lVar2 = 0; lVar2 < (this->theFvec->thedelta).super_IdxSet.num; lVar2 = lVar2 + 1) {
    local_70 = (this->super_SPxBasisBase<double>).theBaseId.data
               [(this->theFvec->thedelta).super_IdxSet.idx[lVar2]].super_DataKey;
    if (local_70.info < 0) {
      SPxRowId::SPxRowId((SPxRowId *)&local_58,(SPxId *)&local_70);
      iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,&local_58);
      local_60 = (this->theFvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(this->theFvec->thedelta).super_IdxSet.idx[lVar2]] * local_48;
      DSVectorBase<double>::add(this_01,iVar1,&local_60);
    }
  }
  if (local_68.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_70,(SPxId *)&local_50);
    iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,&local_70);
    local_58 = (DataKey)((ulong)local_48 ^ 0x8000000000000000);
    DSVectorBase<double>::add(this_01,iVar1,(double *)&local_58);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}